

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O0

int decoder_get_uint_value(ndn_decoder_t *decoder,uint32_t length,uint64_t *value)

{
  uint32_t local_30;
  uint16_t local_2c;
  byte local_29;
  uint32_t temp_value_2;
  uint16_t temp_value_1;
  uint8_t temp_value;
  uint64_t *value_local;
  ndn_decoder_t *pnStack_18;
  uint32_t length_local;
  ndn_decoder_t *decoder_local;
  
  _temp_value_2 = value;
  value_local._4_4_ = length;
  pnStack_18 = decoder;
  if (length == 1) {
    local_29 = 0;
    decoder_get_byte_value(decoder,&local_29);
    *_temp_value_2 = (ulong)local_29;
  }
  else if (length == 2) {
    local_2c = 0;
    decoder_get_uint16_value(decoder,&local_2c);
    *_temp_value_2 = (ulong)local_2c;
  }
  else if (length == 4) {
    local_30 = 0;
    decoder_get_uint32_value(decoder,&local_30);
    *_temp_value_2 = (ulong)local_30;
  }
  else {
    if (length != 8) {
      return -0xd;
    }
    decoder_get_uint64_value(decoder,value);
  }
  return 0;
}

Assistant:

static inline int
decoder_get_uint_value(ndn_decoder_t* decoder, uint32_t length, uint64_t* value)
{
  if (length == 1) {
    uint8_t temp_value = 0;
    decoder_get_byte_value(decoder, &temp_value);
    *value = (uint64_t)temp_value;
  }
  else if (length == 2) {
    uint16_t temp_value = 0;
    decoder_get_uint16_value(decoder, &temp_value);
    *value = (uint64_t)temp_value;
  }
  else if (length == 4) {
    uint32_t temp_value = 0;
    decoder_get_uint32_value(decoder, &temp_value);
    *value = (uint64_t)temp_value;
  }
  else if (length == 8) {
    decoder_get_uint64_value(decoder, value);
  }
  else {
    return NDN_WRONG_TLV_LENGTH;
  }
  return 0;
}